

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

CollectionItrPair * __thiscall
Jinx::Variant::GetCollectionItr(CollectionItrPair *__return_storage_ptr__,Variant *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  Variant v;
  Variant VStack_38;
  
  if (this->m_type == CollectionItr) {
    (__return_storage_ptr__->first)._M_node = (_Base_ptr)(this->field_1).m_number;
    (__return_storage_ptr__->second).
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(this->field_1).m_string._M_string_length;
    p_Var1 = (this->field_1).m_collectionItrPair.second.
             super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (__return_storage_ptr__->second).
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  else {
    Copy(&VStack_38,this);
    bVar2 = ConvertTo(&VStack_38,CollectionItr);
    if (bVar2) {
      GetCollectionItr(__return_storage_ptr__,&VStack_38);
    }
    else {
      (__return_storage_ptr__->first)._M_node = (_Base_ptr)0x0;
      (__return_storage_ptr__->second).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->second).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    Destroy(&VStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t CollectionItrPair Variant::GetCollectionItr() const
	{
		if (IsCollectionItr())
			return m_collectionItrPair;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::CollectionItr))
			return CollectionItrPair();
		return v.GetCollectionItr();
	}